

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::collapseAll(QTreeView *this)

{
  bool bVar1;
  uint uVar2;
  QMetaMethod *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *mi;
  QTreeViewPrivate *d;
  const_iterator i;
  QSet<QPersistentModelIndex> old_expandedIndexes;
  undefined4 in_stack_ffffffffffffff58;
  ItemFlag in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  byte local_89;
  QPersistentModelIndex *in_stack_ffffffffffffff78;
  QPersistentModelIndex local_60 [3];
  undefined4 local_48;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_44 [5];
  undefined1 *local_30;
  undefined1 *local_28;
  QMetaMethod local_20;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTreeView *)0x8fe840);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QPersistentModelIndex>::QSet((QSet<QPersistentModelIndex> *)0x8fe861);
  QSet<QPersistentModelIndex>::operator=
            ((QSet<QPersistentModelIndex> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (QSet<QPersistentModelIndex> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8fe88b);
  bVar1 = QObject::signalsBlocked((QObject *)0x8fe895);
  local_89 = 0;
  if (!bVar1) {
    local_20 = QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>
                         ((offset_in_QTreeView_to_subr)collapsed);
    local_89 = QObject::isSignalConnected(in_RDI);
  }
  if ((local_89 & 1) != 0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QPersistentModelIndex>::constBegin
              ((QSet<QPersistentModelIndex> *)in_stack_ffffffffffffff78);
    while( true ) {
      QSet<QPersistentModelIndex>::constEnd
                ((QSet<QPersistentModelIndex> *)in_stack_ffffffffffffff78);
      bVar1 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                        ((const_iterator *)
                         CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (!bVar1) break;
      in_stack_ffffffffffffff78 =
           QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x8fe969);
      uVar2 = QPersistentModelIndex::isValid();
      in_stack_ffffffffffffff67 = false;
      if ((uVar2 & 1) != 0) {
        local_48 = QPersistentModelIndex::flags();
        local_44[0].super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff67 =
             QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)local_44);
      }
      if ((bool)in_stack_ffffffffffffff67 != false) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_60);
        collapsed((QTreeView *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                  (QModelIndex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      QSet<QPersistentModelIndex>::const_iterator::operator++
                ((const_iterator *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    }
  }
  (*(code *)in_RDI->mobj[9].d.metaTypes)();
  QSet<QPersistentModelIndex>::~QSet((QSet<QPersistentModelIndex> *)0x8fea0f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::collapseAll()
{
    Q_D(QTreeView);
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    if (!signalsBlocked() && isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed))) {
        QSet<QPersistentModelIndex>::const_iterator i = old_expandedIndexes.constBegin();
        for (; i != old_expandedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }
    }
    doItemsLayout();
}